

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

int Sfm_DecPeformDec2(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  uint uVar1;
  Sfm_Par_t *pSVar2;
  word wVar3;
  word wVar4;
  Vec_Int_t *vCut;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  word *pwVar10;
  ulong uVar11;
  ulong uVar12;
  word wVar13;
  int iVar14;
  int (*pSupp_00) [16];
  word (*pTruth) [4];
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int local_1224;
  uint local_1220;
  int local_121c;
  int iLibObj;
  word *local_1208;
  Vec_Int_t *local_1200;
  Vec_Int_t *local_11f8;
  ulong local_11f0;
  int nSupp [4];
  word Masks [2] [8];
  word uTruth [4] [4];
  int pSupp [4] [16];
  int pAssump [1000];
  
  pSVar2 = p->pPars;
  bVar17 = true;
  if (pSVar2->fPrintDecs == 0) {
    bVar17 = pSVar2->fVeryVerbose != 0;
  }
  if (pSVar2->fArea != 1) {
    __assert_fail("p->pPars->fArea == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x454,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  uVar1 = pSVar2->nDecMax;
  if (bVar17) {
    printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
  }
  if (4 < p->pPars->nDecMax) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x459,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  (p->vObjDec).nSize = 0;
  local_1208 = p->Copy;
  local_11f8 = &p->vObjMap;
  local_1200 = &p->vGateCut;
  local_11f0 = 1;
  if (1 < (int)uVar1) {
    local_11f0 = (ulong)uVar1;
  }
  local_1224 = -1;
  uVar16 = 0;
  local_121c = -1;
  local_1220 = 0xffffffff;
  iVar14 = 0;
  do {
    if (iVar14 < (p->vObjDec).nSize) {
      (p->vObjDec).nSize = iVar14;
    }
    uVar1 = p->nPats[0];
    uVar7 = (ulong)uVar1;
    if (0x200 < uVar7) {
LAB_0051ff7f:
      __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0xc6,"void Abc_TtMask(word *, int, int)");
    }
    pTruth = uTruth + uVar16;
    iVar14 = (p->vObjDec).nSize + 1;
    uVar9 = uVar7;
    pwVar10 = Masks[0];
    uVar12 = 0;
    do {
      uVar11 = uVar12 + 0x40;
      wVar13 = 0xffffffffffffffff;
      if (uVar7 < uVar11) {
        if (uVar12 < uVar7) {
          if (0x40 < uVar9) goto LAB_0051ff60;
          wVar13 = 0xffffffffffffffff >> (0x40U - (char)uVar1 & 0x3f);
        }
        else {
          wVar13 = 0;
        }
      }
      *pwVar10 = wVar13;
      pwVar10 = pwVar10 + 1;
      uVar9 = uVar9 - 0x40;
      uVar12 = uVar11;
    } while (uVar11 != 0x200);
    uVar1 = p->nPats[1];
    uVar7 = (ulong)uVar1;
    if (0x200 < uVar7) goto LAB_0051ff7f;
    pwVar10 = Masks[1];
    uVar9 = uVar7;
    uVar12 = 0;
    do {
      uVar11 = uVar12 + 0x40;
      wVar13 = 0xffffffffffffffff;
      if (uVar7 < uVar11) {
        if (uVar12 < uVar7) {
          if (0x40 < uVar9) {
LAB_0051ff60:
            __assert_fail("nBits >= 0 && nBits <= 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0xc2,"word Abc_Tt6Mask(int)");
          }
          wVar13 = 0xffffffffffffffff >> (0x40U - (char)uVar1 & 0x3f);
        }
        else {
          wVar13 = 0;
        }
      }
      *pwVar10 = wVar13;
      pwVar10 = pwVar10 + 1;
      uVar9 = uVar9 - 0x40;
      uVar12 = uVar11;
    } while (uVar11 != 0x200);
    pSupp_00 = pSupp + uVar16;
    iVar5 = Sfm_DecPeformDec_rec(p,*pTruth,*pSupp_00,pAssump,0,Masks,1,0);
    nSupp[uVar16] = iVar5;
    if (iVar5 == -2) {
      if (bVar17) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",uVar16 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (bVar17) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",uVar16 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
        Dau_DsdPrintFromTruth(*pTruth,iVar5);
      }
      if (iVar5 < 2) {
        p->nSuppVars = iVar5;
        wVar13 = (*pTruth)[0];
        wVar3 = uTruth[uVar16][1];
        wVar4 = uTruth[uVar16][3];
        local_1208[2] = uTruth[uVar16][2];
        local_1208[3] = wVar4;
        *local_1208 = wVar13;
        local_1208[1] = wVar3;
        iVar14 = Sfm_LibImplementSimple
                           (p->pLib,*pTruth,*pSupp_00,iVar5,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < iVar5) {
          __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x475,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[iVar5] = p->nLuckySizes[iVar5] + 1;
        if (2 < iVar14) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x477,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        piVar8 = p->nLuckyGates + iVar14;
        goto LAB_0051ff4c;
      }
      p->nSuppVars = iVar5;
      wVar13 = (*pTruth)[0];
      wVar3 = uTruth[uVar16][1];
      wVar4 = uTruth[uVar16][3];
      local_1208[2] = uTruth[uVar16][2];
      local_1208[3] = wVar4;
      *local_1208 = wVar13;
      local_1208[1] = wVar3;
      iVar6 = Sfm_LibFindAreaMatch(p->pLib,*pTruth,iVar5,&iLibObj);
      vCut = local_1200;
      if (iVar6 != -1) {
        Sfm_DecPrepareVec(local_11f8,*pSupp_00,iVar5,local_1200);
        iVar5 = Sfm_DecMffcAreaReal(pObj,vCut,(Vec_Int_t *)0x0);
        if (iVar5 < p->AreaMffc) {
          __assert_fail("p->AreaMffc <= AreaThis",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x492,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        if (p->pPars->fZeroCost == 0) {
          if (iVar6 < iVar5) goto LAB_0051fdde;
        }
        else if (iVar6 <= iVar5) {
LAB_0051fdde:
          iVar5 = iVar5 - iVar6;
          if (iVar5 < 0) {
            __assert_fail("GainThis >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                          ,0x497,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
          }
          if (local_121c < iVar5) {
            local_1224 = iLibObj;
            local_1220 = (uint)uVar16;
            local_121c = iVar5;
          }
        }
      }
    }
    uVar16 = uVar16 + 1;
    if (uVar16 == local_11f0) {
      Sfm_ObjSetdownSimInfo(pObj);
      if (local_1220 == 0xffffffff) {
        if (bVar17) {
          puts("Best  : NO DEC.");
        }
        piVar8 = &p->nNoDecs;
        iVar14 = -2;
      }
      else {
        lVar15 = (long)(int)local_1220;
        if (bVar17) {
          uVar1 = nSupp[lVar15];
          printf("Best %d: %d  ",(ulong)local_1220,(ulong)uVar1);
          Dau_DsdPrintFromTruth(uTruth[lVar15],uVar1);
        }
        if (local_1224 < 0) {
          __assert_fail("iLibObjBest >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4ad,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        iVar14 = nSupp[lVar15];
        iVar5 = Sfm_LibImplementGatesArea
                          (p->pLib,pSupp[lVar15],iVar14,local_1224,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < iVar14) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4af,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[iVar14] = p->nLuckySizes[iVar14] + 1;
        if (2 < iVar5) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4b1,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        piVar8 = p->nLuckyGates + iVar5;
        iVar14 = 1;
      }
LAB_0051ff4c:
      *piVar8 = *piVar8 + 1;
      return iVar14;
    }
  } while( true );
}

Assistant:

int Sfm_DecPeformDec2( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    //int fNeedInv, AreaGainInv = Sfm_DecComputeFlipInvGain(p, pObj, &fNeedInv);
    int i, RetValue, Prev = 0, iBest = -1, AreaThis, AreaNew;//, AreaNewInv;
    int GainThis, GainBest = -1, iLibObj, iLibObjBest = -1; 
    assert( p->pPars->fArea == 1 );
//printf( "AreaGainInv = %8.2f  ", Scl_Int2Flt(AreaGainInv) );
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            //printf( "\n" );
            return RetValue;
        }

        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        AreaNew = Sfm_LibFindAreaMatch( p->pLib, uTruth[i], nSupp[i], &iLibObj );
/*
        uTruth[i][0] = ~uTruth[i][0];
        AreaNewInv = Sfm_LibFindAreaMatch( p->pLib, uTruth[i], nSupp[i], NULL );
        uTruth[i][0] = ~uTruth[i][0];

        if ( AreaNew > 0 && AreaNewInv > 0 && AreaNew - AreaNewInv + AreaGainInv > 0 )
            printf( "AreaNew = %8.2f   AreaNewInv = %8.2f   Gain = %8.2f   Total = %8.2f\n", 
                Scl_Int2Flt(AreaNew), Scl_Int2Flt(AreaNewInv), Scl_Int2Flt(AreaNew - AreaNewInv), Scl_Int2Flt(AreaNew - AreaNewInv + AreaGainInv) );
        else
            printf( "\n" );
*/
        if ( AreaNew == -1 )
            continue;


        // compute area savings
        Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vGateCut );
        AreaThis = Sfm_DecMffcAreaReal(pObj, &p->vGateCut, NULL);
        assert( p->AreaMffc <= AreaThis );
        if ( p->pPars->fZeroCost ? (AreaNew > AreaThis) : (AreaNew >= AreaThis) )
            continue;
        // find the best gain
        GainThis = AreaThis - AreaNew;
        assert( GainThis >= 0 );
        if ( GainBest < GainThis )
        {
            GainBest    = GainThis;
            iLibObjBest = iLibObj;
            iBest       = i;
        }
    }
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        //printf( "\n" );
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
    if ( fVeryVerbose )
      Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    // implement
    assert( iLibObjBest >= 0 );
    RetValue = Sfm_LibImplementGatesArea( p->pLib, pSupp[iBest], nSupp[iBest], iLibObjBest, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    return 1;
}